

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D3MFExporter.cpp
# Opt level: O2

void __thiscall Assimp::D3MF::D3MFExporter::exportContentTyp(D3MFExporter *this,string *filename)

{
  DeadlyImportError *this_00;
  void *local_58;
  size_t local_50;
  string entry;
  
  if (this->m_zipArchive != (zip_t *)0x0) {
    std::__cxx11::string::string((string *)&entry,(string *)filename);
    zip_entry_open(this->m_zipArchive,entry._M_dataplus._M_p);
    std::__cxx11::stringbuf::str();
    zip_entry_write(this->m_zipArchive,local_58,local_50);
    zip_entry_close(this->m_zipArchive);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&entry);
    return;
  }
  this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&entry,"3MF-Export: Zip archive not valid, nullptr.",
             (allocator<char> *)&local_58);
  DeadlyImportError::DeadlyImportError(this_00,&entry);
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void D3MFExporter::exportContentTyp( const std::string &filename ) {
    if ( nullptr == m_zipArchive ) {
        throw DeadlyExportError( "3MF-Export: Zip archive not valid, nullptr." );
    }
    const std::string entry = filename;
    zip_entry_open( m_zipArchive, entry.c_str() );

    const std::string &exportTxt( mContentOutput.str() );
    zip_entry_write( m_zipArchive, exportTxt.c_str(), exportTxt.size() );

    zip_entry_close( m_zipArchive );
}